

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O3

void N_VDestroy_SensWrapper(N_Vector v)

{
  N_Vector v_00;
  long lVar1;
  long *plVar2;
  long lVar3;
  
  plVar2 = (long *)v->content;
  if ((*(int *)((long)plVar2 + 0xc) == 1) && (0 < (int)plVar2[1])) {
    lVar3 = 0;
    do {
      lVar1 = *plVar2;
      v_00 = *(N_Vector *)(lVar1 + lVar3 * 8);
      if (v_00 != (N_Vector)0x0) {
        N_VDestroy(v_00);
        lVar1 = *v->content;
      }
      *(undefined8 *)(lVar1 + lVar3 * 8) = 0;
      lVar3 = lVar3 + 1;
      plVar2 = (long *)v->content;
    } while (lVar3 < (int)plVar2[1]);
  }
  free((void *)*plVar2);
  free(v->content);
  v->content = (void *)0x0;
  free(v->ops);
  free(v);
  return;
}

Assistant:

void N_VDestroy_SensWrapper(N_Vector v)
{
  int i;

  if (NV_OWN_VECS_SW(v) == SUNTRUE) {
    for (i=0; i < NV_NVECS_SW(v); i++) {
      if (NV_VEC_SW(v,i)) N_VDestroy(NV_VEC_SW(v,i));
      NV_VEC_SW(v,i) = NULL;
    }
  }

  free(NV_VECS_SW(v)); NV_VECS_SW(v) = NULL;
  free(v->content); v->content = NULL;
  free(v->ops); v->ops = NULL;
  free(v); v = NULL;

  return;
}